

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOCK5ConnectionMaker.cpp
# Opt level: O3

int __thiscall
SOCK5ConnectionMaker::exchange_data(SOCK5ConnectionMaker *this,fd_set *rdfds,fd_set *wrfds)

{
  byte bVar1;
  uint uVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  int *piVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (this->drop != false) {
    return 0;
  }
  uVar2 = this->client_sock_;
  uVar4 = uVar2 + 0x3f;
  if (-1 < (int)uVar2) {
    uVar4 = uVar2;
  }
  if ((((ulong)rdfds->fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) == 0) ||
     (this->outputbuf_size != 0)) {
LAB_001045b7:
    uVar2 = this->client_sock_;
    uVar4 = uVar2 + 0x3f;
    if (-1 < (int)uVar2) {
      uVar4 = uVar2;
    }
    if (((ulong)wrfds->fds_bits[(int)uVar4 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      return 0;
    }
    if ((long)this->outputbuf_size == 0) {
      return 0;
    }
    sVar6 = send(uVar2,this->outputbuf,(long)this->outputbuf_size,0);
    this->outputbuf_size = 0;
    if (((int)sVar6 == 0) || (((int)sVar6 == -1 && (piVar7 = __errno_location(), *piVar7 != 0xb))))
    {
      this->drop = true;
    }
    if (this->firstStepCompleted != false) {
      return 1;
    }
    this = (SOCK5ConnectionMaker *)&this->firstStepCompleted;
  }
  else {
    sVar6 = recv(uVar2,this->inputbuf,0x400,0);
    iVar5 = (int)sVar6;
    this->inputbuf_size = iVar5;
    if (iVar5 == 0) {
      iVar5 = 1;
      goto LAB_00104658;
    }
    if (iVar5 != -1) {
      if ((0 < iVar5) && (this->firstStepCompleted == false)) {
        this->outputbuf_size = 2;
        this->outputbuf[0] = '\x05';
        this->outputbuf[1] = 0xff;
        if ((ulong)this->inputbuf[1] != 0) {
          uVar8 = 0;
          do {
            if (this->inputbuf[uVar8 + 2] == '\0') {
              this->outputbuf[1] = '\0';
            }
            uVar8 = uVar8 + 1;
          } while (this->inputbuf[1] != uVar8);
        }
        goto LAB_001045b7;
      }
LAB_001046b9:
      this->outputbuf_size = 10;
      this->outputbuf[0] = '\x05';
      this->outputbuf[1] = '\0';
      this->outputbuf[2] = '\0';
      this->outputbuf[3] = '\x01';
      this->outputbuf[4] = '\x7f';
      this->outputbuf[5] = '\0';
      this->outputbuf[6] = '\0';
      this->outputbuf[7] = '\x01';
      *(short *)(this->outputbuf + 8) = (short)this->port;
      if (this->inputbuf[0] != '\x05') {
        this->outputbuf[1] = '\a';
      }
      if (this->inputbuf[1] != '\x01') {
        this->outputbuf[1] = '\a';
      }
      uVar3 = this->inputbuf[3];
      if (uVar3 == '\x03') {
        bVar1 = this->inputbuf[4];
        this->domain = true;
        if (bVar1 == 0) {
          uVar3 = '\x03';
        }
        else {
          uVar8 = 0;
          do {
            std::__cxx11::string::push_back((char)this + '\x18');
            uVar8 = uVar8 + 1;
          } while (bVar1 != uVar8);
          uVar3 = this->inputbuf[3];
        }
        *(uchar *)((long)&this->port + 1) = this->inputbuf[(ulong)bVar1 + 5];
        *(uchar *)&this->port = this->inputbuf[(ulong)bVar1 + 6];
      }
      else if (uVar3 == '\x04') {
        this->outputbuf[1] = '\b';
        goto LAB_001045b7;
      }
      if (uVar3 == '\x01') {
        this->domain = false;
        std::__cxx11::to_string(&local_50,(uint)this->inputbuf[4]);
        std::operator+(&local_f0,&local_50,'.');
        std::__cxx11::to_string(&local_110,(uint)this->inputbuf[5]);
        std::operator+(&local_d0,&local_f0,&local_110);
        std::operator+(&local_b0,&local_d0,'.');
        std::__cxx11::to_string(&local_130,(uint)this->inputbuf[6]);
        std::operator+(&local_90,&local_b0,&local_130);
        std::operator+(&local_70,&local_90,'.');
        std::__cxx11::to_string(&local_150,(uint)this->inputbuf[7]);
        std::operator+(&local_170,&local_70,&local_150);
        std::__cxx11::string::_M_append((char *)&this->addr,(ulong)local_170._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        *(ushort *)&this->port =
             *(ushort *)(this->inputbuf + 8) << 8 | *(ushort *)(this->inputbuf + 8) >> 8;
      }
      goto LAB_001045b7;
    }
    piVar7 = __errno_location();
    if (*piVar7 == 0xb) goto LAB_001046b9;
  }
  iVar5 = 0;
LAB_00104658:
  this->drop = true;
  return iVar5;
}

Assistant:

int SOCK5ConnectionMaker::exchange_data(const fd_set &rdfds, const fd_set &wrfds) {
    if (drop) {
        return 0;
    }
    if (FD_ISSET(client_sock_, &rdfds) && outputbuf_size == 0) {
        inputbuf_size = recv(client_sock_, inputbuf, MAX_BUF_SIZE, 0);
        if (inputbuf_size == 0) {
            drop = true;
            return true;
        }
        if (inputbuf_size == -1 && errno != EWOULDBLOCK) {
            drop = true;
            return 0;
        }
        if (!firstStepCompleted && inputbuf_size > 0) {
            outputbuf_size = 2;
            outputbuf[0] = 0x05;
            outputbuf[1] = 0xFF;
            for (int i = 0; i < inputbuf[1]; i++) { //auth methods
                if (inputbuf[i + 2] == 0x00) {
                    outputbuf[1] = 0x00;
                }
            }
        } else {
            outputbuf_size = 10;
            outputbuf[0] = 0x05;
            outputbuf[1] = 0x00;
            outputbuf[2] = 0x00;
            outputbuf[3] = 0x01;
            //writing my ip
            outputbuf[4] = 127;
            outputbuf[5] = 0;
            outputbuf[6] = 0;
            outputbuf[7] = 1;
            //writing my port
            outputbuf[8] = ((unsigned char *) &port)[0];
            outputbuf[9] = ((unsigned char *) &port)[1];
            if (inputbuf[0] != 0x05) { //if SOCK4
                outputbuf[1] = 0x07;
            }
            if (inputbuf[1] != 0x01) { //if operation does'n support
                outputbuf[1] = 0x07;
            }
            if (inputbuf[3] == 0x04) { //if ipv6
                outputbuf[1] = 0x08;
            }
            if (inputbuf[3] == 0x03) { //if domain
                int k = inputbuf[4];
                domain = true;
                for (int i = 0; i < k; i++) {
                    addr.push_back(inputbuf[i + 5]);
                }
                ((unsigned char *) &port)[1] = inputbuf[k + 5];
                ((unsigned char *) &port)[0] = inputbuf[k + 6];
            }
            if (inputbuf[3] == 0x01) {//if ipv4
                domain = false;
                addr += std::to_string(inputbuf[4]) + '.' + std::to_string(inputbuf[5]) + '.' +
                        std::to_string(inputbuf[6]) + '.' + std::to_string(inputbuf[7]);
                ((unsigned char *) &port)[1] = inputbuf[8];
                ((unsigned char *) &port)[0] = inputbuf[9];
            }
        }
    }
    if (FD_ISSET(client_sock_, &wrfds) && outputbuf_size != 0) {
        int err = send(client_sock_, outputbuf, outputbuf_size, 0);
        outputbuf_size = 0;
        if (err == 0 || (err == -1 && errno != EWOULDBLOCK)) {
            drop = true;
        }
        if (!firstStepCompleted) {
            firstStepCompleted = true;
        } else {
            return 1;
        }
    }
    return 0;
}